

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O0

_Bool find_subscription_by_frame_type(LIST_ITEM_HANDLE list_item,void *match_context)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  SUBSCRIPTION *subscription;
  _Bool result;
  void *match_context_local;
  LIST_ITEM_HANDLE list_item_local;
  
  pcVar1 = (char *)singlylinkedlist_item_get_value(list_item);
  if (pcVar1 == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                ,"find_subscription_by_frame_type",0x41,1,
                "Could not get subscription information from the list item");
    }
    subscription._7_1_ = false;
  }
  else {
    subscription._7_1_ = *pcVar1 == *match_context;
  }
  return subscription._7_1_;
}

Assistant:

static bool find_subscription_by_frame_type(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    bool result;
    SUBSCRIPTION* subscription = (SUBSCRIPTION*)singlylinkedlist_item_get_value(list_item);

    if (subscription == NULL)
    {
        LogError("Could not get subscription information from the list item");
        result = false;
    }
    else
    {
        result = subscription->frame_type == *((uint8_t*)match_context) ? true : false;
    }

    return result;
}